

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

FieldType __thiscall
google::protobuf::internal::ExtensionSet::ExtensionType(ExtensionSet *this,int number)

{
  LogMessage *pLVar1;
  LogFinisher local_a9;
  LogMessage local_a8;
  LogFinisher local_6d [13];
  LogMessage local_60;
  Extension *local_28;
  Extension *ext;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  ext._4_4_ = number;
  pEStack_18 = this;
  local_28 = FindOrNull(this,number);
  if (local_28 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x110);
    pLVar1 = LogMessage::operator<<
                       (&local_60,"Don\'t lookup extension types if they aren\'t present (1). ");
    LogFinisher::operator=(local_6d,pLVar1);
    LogMessage::~LogMessage(&local_60);
    this_local._7_1_ = '\0';
  }
  else {
    if ((local_28->field_0xa & 1) != 0) {
      LogMessage::LogMessage
                (&local_a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x114);
      pLVar1 = LogMessage::operator<<
                         (&local_a8,"Don\'t lookup extension types if they aren\'t present (2). ");
      LogFinisher::operator=(&local_a9,pLVar1);
      LogMessage::~LogMessage(&local_a8);
    }
    this_local._7_1_ = local_28->type;
  }
  return this_local._7_1_;
}

Assistant:

FieldType ExtensionSet::ExtensionType(int number) const {
  const Extension* ext = FindOrNull(number);
  if (ext == nullptr) {
    GOOGLE_LOG(DFATAL) << "Don't lookup extension types if they aren't present (1). ";
    return 0;
  }
  if (ext->is_cleared) {
    GOOGLE_LOG(DFATAL) << "Don't lookup extension types if they aren't present (2). ";
  }
  return ext->type;
}